

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

String * __thiscall
capnp::anon_unknown_79::Parser::consumeQuotedString(String *__return_storage_ptr__,Parser *this)

{
  char cVar1;
  ArrayPtr<const_char> AVar2;
  Array<char> local_a0;
  char local_81;
  Fault local_80;
  Fault f;
  char local_64 [27];
  anon_class_1_0_00000001 local_49;
  undefined1 local_48 [8];
  ArrayPtr<const_char> stringValue;
  Vector<char> decoded;
  Parser *this_local;
  
  Input::consume(&this->input,'\"');
  kj::Vector<char>::Vector((Vector<char> *)&stringValue.size_);
  do {
    AVar2 = (anonymous_namespace)::Input::
            consumeWhile<capnp::(anonymous_namespace)::Parser::consumeQuotedString()::_lambda(char)_1_>
                      ((Input *)&this->input,&local_49);
    stringValue.ptr = (char *)AVar2.size_;
    local_48 = (undefined1  [8])AVar2.ptr;
    kj::Vector<char>::addAll<kj::ArrayPtr<char_const>&>
              ((Vector<char> *)&stringValue.size_,(ArrayPtr<const_char> *)local_48);
    cVar1 = Input::nextChar(&this->input);
    if (cVar1 == '\\') {
      Input::advance(&this->input,1);
      cVar1 = Input::nextChar(&this->input);
      switch(cVar1) {
      case '\"':
        local_64[7] = 0x22;
        kj::Vector<char>::add<char>((Vector<char> *)&stringValue.size_,local_64 + 7);
        Input::advance(&this->input,1);
        break;
      default:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                  (&local_80,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                   ,0x302,FAILED,(char *)0x0,"\"Invalid escape in JSON string.\"",
                   (char (*) [31])"Invalid escape in JSON string.");
        kj::_::Debug::Fault::fatal(&local_80);
      case '/':
        local_64[5] = 0x2f;
        kj::Vector<char>::add<char>((Vector<char> *)&stringValue.size_,local_64 + 5);
        Input::advance(&this->input,1);
        break;
      case '\\':
        local_64[6] = 0x5c;
        kj::Vector<char>::add<char>((Vector<char> *)&stringValue.size_,local_64 + 6);
        Input::advance(&this->input,1);
        break;
      case 'b':
        local_64[4] = 8;
        kj::Vector<char>::add<char>((Vector<char> *)&stringValue.size_,local_64 + 4);
        Input::advance(&this->input,1);
        break;
      case 'f':
        local_64[3] = 0xc;
        kj::Vector<char>::add<char>((Vector<char> *)&stringValue.size_,local_64 + 3);
        Input::advance(&this->input,1);
        break;
      case 'n':
        local_64[2] = 10;
        kj::Vector<char>::add<char>((Vector<char> *)&stringValue.size_,local_64 + 2);
        Input::advance(&this->input,1);
        break;
      case 'r':
        local_64[1] = 0xd;
        kj::Vector<char>::add<char>((Vector<char> *)&stringValue.size_,local_64 + 1);
        Input::advance(&this->input,1);
        break;
      case 't':
        local_64[0] = '\t';
        kj::Vector<char>::add<char>((Vector<char> *)&stringValue.size_,local_64);
        Input::advance(&this->input,1);
        break;
      case 'u':
        Input::consume(&this->input,'u');
        AVar2 = Input::consume(&this->input,4);
        f.exception = (Exception *)AVar2.ptr;
        unescapeAndAppend(this,AVar2,(Vector<char> *)&stringValue.size_);
      }
    }
    cVar1 = Input::nextChar(&this->input);
  } while (cVar1 != '\"');
  Input::consume(&this->input,'\"');
  local_81 = '\0';
  kj::Vector<char>::add<char>((Vector<char> *)&stringValue.size_,&local_81);
  kj::Vector<char>::releaseAsArray(&local_a0,(Vector<char> *)&stringValue.size_);
  kj::String::String(__return_storage_ptr__,&local_a0);
  kj::Array<char>::~Array(&local_a0);
  kj::Vector<char>::~Vector((Vector<char> *)&stringValue.size_);
  return __return_storage_ptr__;
}

Assistant:

kj::String consumeQuotedString() {
    input.consume('"');
    // TODO(perf): Avoid copy / alloc if no escapes encoutered.
    // TODO(perf): Get statistics on string size and preallocate?
    kj::Vector<char> decoded;

    do {
      auto stringValue = input.consumeWhile([](const char chr) {
          return chr != '"' && chr != '\\';
      });

      decoded.addAll(stringValue);

      if (input.nextChar() == '\\') {  // handle escapes.
        input.advance();
        switch(input.nextChar()) {
          case '"' : decoded.add('"' ); input.advance(); break;
          case '\\': decoded.add('\\'); input.advance(); break;
          case '/' : decoded.add('/' ); input.advance(); break;
          case 'b' : decoded.add('\b'); input.advance(); break;
          case 'f' : decoded.add('\f'); input.advance(); break;
          case 'n' : decoded.add('\n'); input.advance(); break;
          case 'r' : decoded.add('\r'); input.advance(); break;
          case 't' : decoded.add('\t'); input.advance(); break;
          case 'u' :
            input.consume('u');
            unescapeAndAppend(input.consume(size_t(4)), decoded);
            break;
          default: KJ_FAIL_REQUIRE("Invalid escape in JSON string."); break;
        }
      }

    } while(input.nextChar() != '"');

    input.consume('"');
    decoded.add('\0');

    // TODO(perf): This copy can be eliminated, but I can't find the kj::wayToDoIt();
    return kj::String(decoded.releaseAsArray());
  }